

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O1

aspa_status
aspa_table_update_in_place_undo
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update_operation *failed_operation)

{
  aspa_update_operation *paVar1;
  long lVar2;
  aspa_array *array;
  aspa_status aVar3;
  aspa_store_node **ppaVar4;
  aspa_update_operation *paVar5;
  aspa_record *paVar6;
  aspa_store_node *paVar7;
  aspa_store_node *paVar8;
  uint uVar9;
  ulong index;
  ulong uVar10;
  size_t *psVar11;
  aspa_status aVar12;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  uint local_5c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x37b,
                  "enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x37c,
                  "enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (count == 0 || operations == (aspa_update_operation *)0x0) {
    aVar3 = -(uint)(operations == (aspa_update_operation *)0x0 && count != 0);
    goto LAB_0010ea6b;
  }
  if (operations == (aspa_update_operation *)0x0) {
    __assert_fail("operations",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x2fe,
                  "enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
  paVar7 = aspa_table->store;
  if (paVar7 == (aspa_store_node *)0x0) {
    ppaVar4 = (aspa_store_node **)0x0;
  }
  else if (paVar7->rtr_socket == rtr_socket) {
    ppaVar4 = &aspa_table->store;
  }
  else {
    ppaVar4 = (aspa_store_node **)0x0;
    do {
      paVar8 = paVar7;
      paVar7 = paVar8->next;
      if (paVar7 == (aspa_store_node *)0x0) goto LAB_0010e7c0;
    } while (paVar7->rtr_socket != rtr_socket);
    ppaVar4 = &paVar8->next;
  }
LAB_0010e7c0:
  aVar12 = ASPA_ERROR;
  if (((ppaVar4 == (aspa_store_node **)0x0) || (paVar7 = *ppaVar4, paVar7 == (aspa_store_node *)0x0)
      ) || (array = paVar7->aspa_array, array == (aspa_array *)0x0)) {
LAB_0010ea40:
    aVar3 = aVar12;
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
  }
  else {
    if (array->size == 0) {
      bVar13 = true;
    }
    else {
      index = 0;
      uVar10 = 0;
      do {
        paVar1 = operations + uVar10;
        paVar5 = operations + uVar10 + 1;
        if (count - 1 <= uVar10) {
          paVar5 = (aspa_update_operation *)0x0;
        }
        if ((failed_operation == (aspa_update_operation *)0x0) ||
           (uVar9 = 2, paVar1 != failed_operation)) {
          while ((index < array->size &&
                 (paVar6 = aspa_array_get_record(array,index),
                 paVar6->customer_asn < (paVar1->record).customer_asn))) {
            index = index + 1;
          }
          paVar6 = aspa_array_get_record(array,index);
          if (paVar6 == (aspa_record *)0x0) {
            bVar13 = false;
          }
          else {
            bVar13 = paVar6->customer_asn == (paVar1->record).customer_asn;
          }
          uVar9 = 0;
          bVar14 = false;
          if (uVar10 < count - 1) {
            bVar14 = (paVar5->record).customer_asn == (paVar1->record).customer_asn;
          }
          if (paVar1->type == ASPA_REMOVE) {
            if (((bool)(bVar14 & bVar13)) && (paVar5->type == ASPA_ADD)) {
              if (paVar6->provider_asns != (uint32_t *)0x0) {
                lrtr_free(paVar6->provider_asns);
              }
              paVar6->provider_asns = (paVar1->record).provider_asns;
              paVar6->provider_count = (paVar1->record).provider_count;
              aspa_table_notify_clients(aspa_table,&paVar5->record,rtr_socket,ASPA_REMOVE);
              uVar10 = uVar10 + 1;
LAB_0010e9ed:
              aspa_table_notify_clients(aspa_table,&paVar1->record,rtr_socket,ASPA_ADD);
              (paVar1->record).provider_count = 0;
              (paVar1->record).provider_asns = (uint32_t *)0x0;
              uVar9 = 0;
            }
            else {
              if (bVar13) {
                pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
                local_5c = 0xfffffffe;
              }
              else {
                aVar3 = aspa_array_insert(array,index,&paVar1->record,false);
                if (aVar3 == ASPA_SUCCESS) goto LAB_0010e9ed;
                pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
                local_5c = 0xffffffff;
              }
LAB_0010e9a4:
              uVar9 = 1;
            }
          }
          else if (paVar1->type == ASPA_ADD) {
            if (!bVar13) {
LAB_0010e8e7:
              pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
              local_5c = 0xfffffffd;
              goto LAB_0010e9a4;
            }
            if ((bVar14) && (paVar5->type == ASPA_REMOVE)) {
              paVar1->is_no_op = true;
              paVar5->is_no_op = true;
              uVar9 = 4;
              uVar10 = uVar10 + 1;
            }
            else {
              aVar3 = aspa_array_remove(array,index,true);
              if (aVar3 != ASPA_SUCCESS) goto LAB_0010e8e7;
              aspa_table_notify_clients(aspa_table,&paVar1->record,rtr_socket,ASPA_REMOVE);
              uVar9 = 0;
            }
          }
        }
        if ((uVar9 & 3) != 0) goto LAB_0010ea26;
        uVar10 = uVar10 + 1;
      } while (uVar10 < array->size);
      uVar9 = 2;
LAB_0010ea26:
      bVar13 = uVar9 == 2;
      paVar7 = (aspa_store_node *)(ulong)local_5c;
    }
    aVar3 = (aspa_status)paVar7;
    aVar12 = ASPA_SUCCESS;
    if (bVar13) goto LAB_0010ea40;
  }
  if (count != 0) {
    psVar11 = &(operations->record).provider_count;
    do {
      if (*(char *)(psVar11 + -2) == '\0') {
        *psVar11 = 0;
        psVar11[1] = 0;
      }
      psVar11 = psVar11 + 6;
      count = count - 1;
    } while (count != 0);
  }
LAB_0010ea6b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return aVar3;
}

Assistant:

enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
						 struct aspa_update_operation *operations, size_t count,
						 struct aspa_update_operation *failed_operation)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);

	if (!aspa_table || !rtr_socket || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	enum aspa_status res =
		aspa_table_update_in_place_undo_internal(aspa_table, rtr_socket, operations, count, failed_operation);

	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *op = &operations[i];

		// If it's a remove operation, we inserted a reference to the removed record's providers.
		// Restore that 'remove' operation back to its original state.
		if (op->type == ASPA_REMOVE) {
			op->record.provider_asns = NULL;
			op->record.provider_count = 0;
		}
	}

	return res;
}